

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_global_isFinite(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  undefined8 in_RDX;
  JSContext *in_RSI;
  double *in_RDI;
  double d;
  BOOL res;
  undefined8 local_68;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val.tag._0_4_ = in_stack_ffffffffffffffd0;
  val.u = (JSValueUnion)in_RDX;
  val.tag._4_4_ = in_stack_ffffffffffffffd4;
  iVar2 = JS_ToFloat64(in_RSI,in_RDI,val);
  if (iVar2 == 0) {
    uVar3 = (uint)((local_68 & 0x7fffffffffffffff) < 0x7ff0000000000000);
    local_28 = 1;
    in_stack_ffffffffffffffd4 = uStack_c;
  }
  else {
    uVar3 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = uVar3;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_global_isFinite(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    BOOL res;
    double d;
    if (unlikely(JS_ToFloat64(ctx, &d, argv[0])))
        return JS_EXCEPTION;
    res = isfinite(d);
    return JS_NewBool(ctx, res);
}